

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O1

int __thiscall DIS::AggregateStatePdu::getMarshalledSize(AggregateStatePdu *this)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  pointer pAVar11;
  pointer pEVar12;
  pointer pEVar13;
  pointer pVVar14;
  ulong uVar15;
  long lVar16;
  AggregateID listElement;
  VariableDatum local_60;
  
  iVar2 = EntityManagementFamilyPdu::getMarshalledSize(&this->super_EntityManagementFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_aggregateID);
  iVar4 = EntityType::getMarshalledSize(&this->_aggregateType);
  iVar5 = AggregateMarking::getMarshalledSize(&this->_aggregateMarking);
  iVar6 = Vector3Float::getMarshalledSize(&this->_dimensions);
  iVar7 = Orientation::getMarshalledSize(&this->_orientation);
  iVar8 = Vector3Double::getMarshalledSize(&this->_centerOfMass);
  iVar9 = Vector3Float::getMarshalledSize(&this->_velocity);
  iVar2 = iVar7 + iVar6 + iVar8 + iVar5 + iVar4 + iVar3 + iVar2 + iVar9 + 0xe;
  pAVar11 = (this->_aggregateIDList).
            super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_aggregateIDList).
      super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar11) {
    lVar16 = 8;
    uVar15 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__AggregateID_0019f338;
      local_60._variableDatumLength._0_2_ =
           *(undefined2 *)((long)&pAVar11->_vptr_AggregateID + lVar16 + 4);
      local_60._variableDatumID = *(uint *)((long)&pAVar11->_vptr_AggregateID + lVar16);
      iVar3 = AggregateID::getMarshalledSize((AggregateID *)&local_60);
      iVar2 = iVar2 + iVar3;
      AggregateID::~AggregateID((AggregateID *)&local_60);
      uVar15 = uVar15 + 1;
      pAVar11 = (this->_aggregateIDList).
                super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x10;
    } while (uVar15 < (ulong)((long)(this->_aggregateIDList).
                                    super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar11 >> 4)
            );
  }
  pEVar12 = (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
      _M_impl.super__Vector_impl_data._M_finish != pEVar12) {
    lVar16 = 8;
    uVar15 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__EntityID_0019fcb8;
      local_60._variableDatumLength._0_2_ =
           *(undefined2 *)((long)&pEVar12->_vptr_EntityID + lVar16 + 4);
      local_60._variableDatumID = *(uint *)((long)&pEVar12->_vptr_EntityID + lVar16);
      iVar3 = EntityID::getMarshalledSize((EntityID *)&local_60);
      iVar2 = iVar2 + iVar3;
      EntityID::~EntityID((EntityID *)&local_60);
      uVar15 = uVar15 + 1;
      pEVar12 = (this->_entityIDList).
                super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x10;
    } while (uVar15 < (ulong)((long)(this->_entityIDList).
                                    super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar12 >> 4)
            );
  }
  iVar2 = iVar2 + 1;
  pEVar13 = (this->_silentAggregateSystemList).
            super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_silentAggregateSystemList).
      super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar13) {
    lVar16 = 8;
    uVar15 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__EntityType_0019fe40;
      local_60._8_8_ = *(undefined8 *)((long)&pEVar13->_vptr_EntityType + lVar16);
      iVar3 = EntityType::getMarshalledSize((EntityType *)&local_60);
      iVar2 = iVar2 + iVar3;
      EntityType::~EntityType((EntityType *)&local_60);
      uVar15 = uVar15 + 1;
      pEVar13 = (this->_silentAggregateSystemList).
                super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x10;
    } while (uVar15 < (ulong)((long)(this->_silentAggregateSystemList).
                                    super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar13 >> 4)
            );
  }
  pEVar13 = (this->_silentEntitySystemList).
            super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_silentEntitySystemList).
      super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar13) {
    lVar16 = 8;
    uVar15 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__EntityType_0019fe40;
      local_60._8_8_ = *(undefined8 *)((long)&pEVar13->_vptr_EntityType + lVar16);
      iVar3 = EntityType::getMarshalledSize((EntityType *)&local_60);
      iVar2 = iVar2 + iVar3;
      EntityType::~EntityType((EntityType *)&local_60);
      uVar15 = uVar15 + 1;
      pEVar13 = (this->_silentEntitySystemList).
                super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x10;
    } while (uVar15 < (ulong)((long)(this->_silentEntitySystemList).
                                    super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar13 >> 4)
            );
  }
  iVar2 = iVar2 + 4;
  pVVar14 = (this->_variableDatumList).
            super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_variableDatumList).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar14) {
    lVar16 = 0x28;
    uVar15 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__VariableDatum_001a1730;
      puVar1 = (uint *)((long)&pVVar14->_vptr_VariableDatum + lVar16);
      local_60._variableDatumID = puVar1[-8];
      local_60._variableDatumLength = puVar1[-7];
      std::vector<char,_std::allocator<char>_>::vector
                (&local_60._variableDatums,(vector<char,_std::allocator<char>_> *)(puVar1 + -6));
      local_60._arrayLength = *puVar1;
      uVar10 = VariableDatum::getMarshalledSize(&local_60);
      iVar2 = iVar2 + uVar10;
      VariableDatum::~VariableDatum(&local_60);
      uVar15 = uVar15 + 1;
      pVVar14 = (this->_variableDatumList).
                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x30;
    } while (uVar15 < (ulong)(((long)(this->_variableDatumList).
                                     super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >> 4
                              ) * -0x5555555555555555));
  }
  return iVar2;
}

Assistant:

int AggregateStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = EntityManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _aggregateID.getMarshalledSize();  // _aggregateID
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _aggregateState
   marshalSize = marshalSize + _aggregateType.getMarshalledSize();  // _aggregateType
   marshalSize = marshalSize + 4;  // _formation
   marshalSize = marshalSize + _aggregateMarking.getMarshalledSize();  // _aggregateMarking
   marshalSize = marshalSize + _dimensions.getMarshalledSize();  // _dimensions
   marshalSize = marshalSize + _orientation.getMarshalledSize();  // _orientation
   marshalSize = marshalSize + _centerOfMass.getMarshalledSize();  // _centerOfMass
   marshalSize = marshalSize + _velocity.getMarshalledSize();  // _velocity
   marshalSize = marshalSize + 2;  // _numberOfDisAggregates
   marshalSize = marshalSize + 2;  // _numberOfDisEntities
   marshalSize = marshalSize + 2;  // _numberOfSilentAggregateTypes
   marshalSize = marshalSize + 2;  // _numberOfSilentEntityTypes

   for(unsigned long long idx=0; idx < _aggregateIDList.size(); idx++)
   {
        AggregateID listElement = _aggregateIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _entityIDList.size(); idx++)
   {
        EntityID listElement = _entityIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

   marshalSize = marshalSize + 1;  // _pad2

   for(unsigned long long idx=0; idx < _silentAggregateSystemList.size(); idx++)
   {
        EntityType listElement = _silentAggregateSystemList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _silentEntitySystemList.size(); idx++)
   {
        EntityType listElement = _silentEntitySystemList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _variableDatumList.size(); idx++)
   {
        VariableDatum listElement = _variableDatumList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}